

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

bool __thiscall
cmStandardLevelResolver::CheckCompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *targetName,string *feature,string *lang,
          string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmValue arg;
  ostream *poVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableFeatures;
  ostringstream e;
  
  bVar2 = CompileFeatureKnown(this,targetName,feature,lang,error);
  if (bVar2) {
    this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
    if (!bVar2) {
      return true;
    }
    arg = CompileFeaturesAvailable(this,lang,error);
    if (arg.Value != (string *)0x0) {
      cmExpandedList_abi_cxx11_(&availableFeatures,arg,false);
      bVar2 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&availableFeatures,feature);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,"The compiler feature \"");
        poVar3 = std::operator<<(poVar3,(string *)feature);
        poVar3 = std::operator<<(poVar3,"\" is not known to ");
        poVar3 = std::operator<<(poVar3,(string *)lang);
        poVar3 = std::operator<<(poVar3," compiler\n\"");
        pcVar1 = this->Makefile;
        std::operator+(&local_1e0,"CMAKE_",lang);
        std::operator+(&local_240,&local_1e0,"_COMPILER_ID");
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_240);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        poVar3 = std::operator<<(poVar3,"\"\nversion ");
        pcVar1 = this->Makefile;
        std::operator+(&local_220,"CMAKE_",lang);
        std::operator+(&local_200,&local_220,"_COMPILER_VERSION");
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_200);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::operator<<(poVar3,".");
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_1e0);
        if (error == (string *)0x0) {
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_240);
        }
        else {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)error,(string *)&local_240);
        }
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&availableFeatures);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmStandardLevelResolver::CheckCompileFeaturesAvailable(
  const std::string& targetName, const std::string& feature, std::string& lang,
  std::string* error) const
{
  if (!this->CompileFeatureKnown(targetName, feature, lang, error)) {
    return false;
  }

  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    return true;
  }

  cmValue features = this->CompileFeaturesAvailable(lang, error);
  if (!features) {
    return false;
  }

  std::vector<std::string> availableFeatures = cmExpandedList(features);
  if (!cm::contains(availableFeatures, feature)) {
    std::ostringstream e;
    e << "The compiler feature \"" << feature << "\" is not known to " << lang
      << " compiler\n\""
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang +
                                           "_COMPILER_VERSION")
      << ".";
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return false;
  }

  return true;
}